

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_byte_string(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 byte_string_view *b,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  ulong uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  pointer psVar5;
  size_t sVar6;
  
  uVar2 = b->size_;
  if (uVar2 < 0x100) {
    binary_stream_sink::push_back(&this->sink_,0xc4);
    binary_stream_sink::push_back(&this->sink_,(uint8_t)uVar2);
  }
  else if (uVar2 < 0x10000) {
    binary_stream_sink::push_back(&this->sink_,0xc5);
    binary::
    native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((unsigned_short)uVar2,
               (back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
  }
  else if (uVar2 >> 0x20 == 0) {
    binary_stream_sink::push_back(&this->sink_,0xc6);
    binary::
    native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uint)uVar2,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
  }
  puVar3 = b->data_;
  sVar4 = b->size_;
  for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
    binary_stream_sink::push_back(&this->sink_,puVar3[sVar6]);
  }
  psVar5 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar5) {
    psVar1 = &psVar5[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
            semantic_tag, 
            const ser_context&,
            std::error_code&) final
        {

            const std::size_t length = b.size();
            if (length <= (std::numeric_limits<uint8_t>::max)())
            {
                // bin 8 stores a byte array whose length is upto (2^8)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin8_type);
                sink_.push_back(static_cast<uint8_t>(length));
            }
            else if (length <= (std::numeric_limits<uint16_t>::max)())
            {
                // bin 16 stores a byte array whose length is upto (2^16)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin16_type);
                binary::native_to_big(static_cast<uint16_t>(length), std::back_inserter(sink_));
            }
            else if (length <= (std::numeric_limits<uint32_t>::max)())
            {
                // bin 32 stores a byte array whose length is upto (2^32)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin32_type);
                binary::native_to_big(static_cast<uint32_t>(length),std::back_inserter(sink_));
            }

            for (auto c : b)
            {
                sink_.push_back(c);
            }

            end_value();
            JSONCONS_VISITOR_RETURN;
        }